

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::RemoveEmptyLoopAfterMemOp(BackwardPass *this,Loop *loop)

{
  BasicBlock *block;
  BasicBlock *this_00;
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  uint uVar4;
  BasicBlock *this_01;
  undefined4 *puVar5;
  Type_conflict pSVar6;
  Type *ppFVar7;
  BasicBlock *pBVar8;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar9;
  Instr *pIVar10;
  Instr *this_02;
  LabelInstr *branchTarget;
  BranchInstr *newInstr;
  bool local_d9;
  BranchInstr *outerBr;
  LabelInstr *label;
  Instr *firstOuterInstr;
  Iterator iter;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *succList;
  BasicBlock *outerBlock;
  BasicBlock *landingPad;
  BasicBlock *tail;
  BasicBlock *head;
  Loop *loop_local;
  BackwardPass *this_local;
  
  this_01 = Loop::GetHeadBlock(loop);
  block = this_01->next;
  this_00 = loop->landingPad;
  iter.current = (NodeBase *)BasicBlock::GetSuccList(this_01);
  bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::HasTwo
                    ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)iter.current);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x241d,"(succList->HasTwo())","succList->HasTwo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
            ((Iterator *)&firstOuterInstr,
             (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)iter.current);
  if (iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pIVar10 = firstOuterInstr;
  pSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
  bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                    ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)pIVar10,pSVar6);
  if (bVar2) {
    iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  }
  else {
    iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
  }
  ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                      ((Iterator *)&firstOuterInstr);
  pBVar8 = FlowEdge::GetSucc(*ppFVar7);
  if (pBVar8 == block) {
    if (iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)firstOuterInstr,
                       pSVar6);
    if (bVar2) {
      iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    }
    else {
      iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&firstOuterInstr);
    succList = (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)FlowEdge::GetSucc(*ppFVar7);
  }
  else {
    ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&firstOuterInstr);
    succList = (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)FlowEdge::GetSucc(*ppFVar7);
    if (iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pSVar6 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)firstOuterInstr,
                       pSVar6);
    if (bVar2) {
      iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    }
    else {
      iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&firstOuterInstr);
    pBVar8 = FlowEdge::GetSucc(*ppFVar7);
    if (pBVar8 != block) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x242c,"(iter.Data()->GetSucc() == tail)","iter.Data()->GetSucc() == tail"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  BasicBlock::RemovePred((BasicBlock *)succList,this_01,this->func->m_fg);
  BasicBlock::RemoveSucc(this_00,this_01,this->func->m_fg);
  pSVar9 = BasicBlock::GetSuccList(this_00);
  uVar4 = RealCount::Count(&(pSVar9->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>)
                            .super_RealCount);
  if (uVar4 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2432,"(landingPad->GetSuccList()->Count() == 0)",
                       "landingPad->GetSuccList()->Count() == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pIVar10 = BasicBlock::GetFirstInstr((BasicBlock *)succList);
  IVar3 = IR::Instr::GetKind(pIVar10);
  local_d9 = true;
  if (IVar3 != InstrKindLabel) {
    local_d9 = IR::Instr::IsProfiledLabelInstr(pIVar10);
  }
  if (local_d9 != false) {
    this_02 = BasicBlock::GetLastInstr(this_00);
    bVar2 = IR::Instr::EndsBasicBlock(this_02);
    if (!bVar2) goto LAB_004e6a8d;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                     ,0x2435,
                     "(firstOuterInstr->IsLabelInstr() && !landingPad->GetLastInstr()->EndsBasicBlock())"
                     ,
                     "firstOuterInstr->IsLabelInstr() && !landingPad->GetLastInstr()->EndsBasicBlock()"
                    );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 0;
LAB_004e6a8d:
  branchTarget = IR::Instr::AsLabelInstr(pIVar10);
  newInstr = IR::BranchInstr::New(Br,branchTarget,this->func);
  BasicBlock::InsertAfter(this_00,&newInstr->super_Instr);
  FlowGraph::AddEdge(this->func->m_fg,this_00,(BasicBlock *)succList);
  FlowGraph::RemoveBlock(this->func->m_fg,this_01,(GlobOpt *)0x0,false);
  if (this_01 != block) {
    FlowGraph::RemoveBlock(this->func->m_fg,block,(GlobOpt *)0x0,false);
  }
  return;
}

Assistant:

void
BackwardPass::RemoveEmptyLoopAfterMemOp(Loop *loop)
{
    BasicBlock *head = loop->GetHeadBlock();
    BasicBlock *tail = head->next;
    BasicBlock *landingPad = loop->landingPad;
    BasicBlock *outerBlock = nullptr;
    SListBaseCounted<FlowEdge *> *succList = head->GetSuccList();
    Assert(succList->HasTwo());

    // Between the two successors of head, one is tail and the other one is the outerBlock
    SListBaseCounted<FlowEdge *>::Iterator  iter(succList);
    iter.Next();
    if (iter.Data()->GetSucc() == tail)
    {
        iter.Next();
        outerBlock = iter.Data()->GetSucc();
    }
    else
    {
        outerBlock = iter.Data()->GetSucc();
#ifdef DBG
        iter.Next();
        Assert(iter.Data()->GetSucc() == tail);
#endif
    }

    outerBlock->RemovePred(head, this->func->m_fg);
    landingPad->RemoveSucc(head, this->func->m_fg);
    Assert(landingPad->GetSuccList()->Count() == 0);

    IR::Instr* firstOuterInstr = outerBlock->GetFirstInstr();
    AssertOrFailFast(firstOuterInstr->IsLabelInstr() && !landingPad->GetLastInstr()->EndsBasicBlock());
    IR::LabelInstr* label = firstOuterInstr->AsLabelInstr();
    // Add br to Outer block to keep coherence between branches and flow graph
    IR::BranchInstr *outerBr = IR::BranchInstr::New(Js::OpCode::Br, label, this->func);
    landingPad->InsertAfter(outerBr);
    this->func->m_fg->AddEdge(landingPad, outerBlock);

    this->func->m_fg->RemoveBlock(head, nullptr);

    if (head != tail)
    {
        this->func->m_fg->RemoveBlock(tail, nullptr);
    }
}